

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

void ProcessThread::removePid(pid_t f_pid)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&sProcessMutex);
  if (iVar1 == 0) {
    if (sProcesses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var3 = &sProcesses._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var2 = sProcesses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        if (f_pid <= (int)p_Var2[1]._M_color) {
          p_Var3 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < f_pid];
      } while (p_Var2 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var3 != &sProcesses._M_t._M_impl.super__Rb_tree_header) &&
         ((int)p_Var3[1]._M_color <= f_pid)) {
        p_Var3[1]._M_parent = (_Base_ptr)0x0;
        _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var3[1]._M_left = (_Base_ptr)0x0;
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var3[1]._M_right,&_Stack_10);
        if (_Stack_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_10._M_pi);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&sProcessMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ProcessThread::removePid(pid_t f_pid)
{
    std::lock_guard<std::mutex> lock(sProcessMutex);

    auto it = sProcesses.find(f_pid);
    if (it != sProcesses.end()) {
        it->second.proc = nullptr;
        it->second.loop = EventLoop::SharedPtr();
    }
}